

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::anon_unknown_1::CoordVertexShader::shadeVertices
          (CoordVertexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  int i;
  long lVar2;
  ulong uVar3;
  Vec4 position;
  deUint32 local_58 [4];
  Vec4 local_48;
  
  if (0 < numPackets) {
    uVar3 = 0;
    do {
      pVVar1 = packets[uVar3];
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_48,inputs,pVVar1->instanceNdx,pVVar1->vertexNdx);
      lVar2 = 0;
      do {
        local_58[lVar2] = 0x3f800000;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      pVVar1->outputs[0].v.uData[0] = local_58[0];
      pVVar1->outputs[0].v.uData[1] = local_58[1];
      pVVar1->outputs[0].v.uData[2] = local_58[2];
      pVVar1->outputs[0].v.uData[3] = local_58[3];
      (pVVar1->position).m_data[0] = local_48.m_data[0] + -0.5 + local_48.m_data[0] + -0.5;
      (pVVar1->position).m_data[1] = local_48.m_data[1] + -0.5 + local_48.m_data[1] + -0.5;
      (pVVar1->position).m_data[2] = 0.0;
      (pVVar1->position).m_data[3] = 1.0;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)numPackets);
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::VertexPacket* const		packet		= packets[packetNdx];
			tcu::Vec4					position;

			readVertexAttrib(position, inputs[0], packet->instanceNdx, packet->vertexNdx);

			packet->outputs[0]	= tcu::Vec4(1.0f);
			packet->position	= tcu::Vec4(2.0f * (position.x() - 0.5f), 2.0f * (position.y() - 0.5f), 0.0f, 1.0f);
		}
	}